

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkSpirVProgram.hpp
# Opt level: O3

SpirVAsmSource * vk::operator<<(SpirVAsmSource *src,char **val)

{
  char **in_RDX;
  string local_30;
  
  de::toString<char_const*>(&local_30,(de *)val,in_RDX);
  std::__cxx11::string::_M_append((char *)src,(ulong)local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return src;
}

Assistant:

SpirVAsmSource& operator<< (SpirVAsmSource& src, const T& val)
{
	src.source += de::toString(val);
	return src;
}